

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall wasm::Pass::~Pass(Pass *this)

{
  Pass *this_local;
  
  this->_vptr_Pass = (_func_int **)&PTR__Pass_0043c748;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&this->passArg);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~Pass() = default;